

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O2

bool __thiscall PDFParser::ReadNextBufferFromEnd(PDFParser *this)

{
  InputOffsetStream *this_00;
  LongFilePositionType LVar1;
  LongFilePositionType LVar2;
  ulong uVar3;
  
  if (this->mEncounteredFileStart == false) {
    this_00 = &this->mStream;
    InputOffsetStream::SetPositionFromEnd(this_00,this->mLastReadPositionFromEnd);
    LVar1 = InputOffsetStream::GetCurrentPosition(this_00);
    InputOffsetStream::SetPositionFromEnd(this_00,this->mLastReadPositionFromEnd + 0x400);
    LVar2 = InputOffsetStream::GetCurrentPosition(this_00);
    if (LVar1 - LVar2 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = InputOffsetStream::Read(this_00,this->mLinesBuffer,LVar1 - LVar2);
    }
    this->mEncounteredFileStart = uVar3 < 0x400;
    if (uVar3 != 0) {
      this->mLastAvailableIndex = this->mLinesBuffer + uVar3;
      this->mCurrentBufferIndex = this->mLinesBuffer + uVar3;
      this->mLastReadPositionFromEnd = this->mLastReadPositionFromEnd + uVar3;
    }
    return uVar3 != 0;
  }
  return false;
}

Assistant:

bool PDFParser::ReadNextBufferFromEnd()
{
	if(mEncounteredFileStart)
	{
		return false;
	}
	else
	{
		mStream.SetPositionFromEnd(mLastReadPositionFromEnd); // last known position that worked.
		LongFilePositionType positionBefore = mStream.GetCurrentPosition();
		mStream.SetPositionFromEnd(mLastReadPositionFromEnd + LINE_BUFFER_SIZE); // try earlier one
		LongFilePositionType positionAfter = mStream.GetCurrentPosition();
		LongBufferSizeType readAmount = positionBefore - positionAfter; // check if got to start by testing position
		if(readAmount != 0)
			readAmount = mStream.Read(mLinesBuffer,readAmount);
		mEncounteredFileStart = readAmount < LINE_BUFFER_SIZE;
		if(0 == readAmount)
			return false;
		mLastAvailableIndex = mLinesBuffer + readAmount;
		mCurrentBufferIndex = mLastAvailableIndex;
		mLastReadPositionFromEnd+= readAmount;
		return true;
	}
}